

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O3

void __thiscall
chrono::ChMatterSPH::IntStateGather
          (ChMatterSPH *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  pointer psVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  element_type *peVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)(this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1;
  if (lVar12 != 0) {
    pdVar2 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    lVar3 = (x->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    pdVar4 = (v->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    lVar5 = (v->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    uVar14 = 0;
    uVar8 = off_v;
    uVar13 = off_x;
    do {
      iVar7 = (int)uVar14 * 3;
      uVar10 = (ulong)(iVar7 + off_x);
      if (lVar3 + -3 < (long)uVar10) goto LAB_00538ec4;
      peVar6 = psVar1[uVar14].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      uVar11 = 3;
      if (((ulong)(pdVar2 + uVar10) & 7) == 0) {
        uVar9 = -((uint)((ulong)(pdVar2 + uVar10) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar9 < 3) {
          uVar11 = (ulong)uVar9;
        }
        if (uVar9 != 0) goto LAB_00538df0;
      }
      else {
LAB_00538df0:
        uVar10 = 0;
        do {
          pdVar2[uVar13 + uVar10] = *(double *)((long)&peVar6->super_ChNodeXYZ + uVar10 * 8 + 8);
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      if (uVar11 < 3) {
        do {
          pdVar2[uVar13 + uVar11] = *(double *)((long)&peVar6->super_ChNodeXYZ + uVar11 * 8 + 8);
          uVar11 = uVar11 + 1;
        } while (uVar11 != 3);
      }
      uVar10 = (ulong)(iVar7 + off_v);
      if (lVar5 + -3 < (long)uVar10) {
LAB_00538ec4:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar11 = 3;
      if (((ulong)(pdVar4 + uVar10) & 7) == 0) {
        uVar9 = -((uint)((ulong)(pdVar4 + uVar10) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar9 < 3) {
          uVar11 = (ulong)uVar9;
        }
        if (uVar9 != 0) goto LAB_00538e5a;
      }
      else {
LAB_00538e5a:
        uVar10 = 0;
        do {
          pdVar4[uVar8 + uVar10] = *(double *)((long)&peVar6->super_ChNodeXYZ + uVar10 * 8 + 0x20);
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      if (uVar11 < 3) {
        do {
          pdVar4[uVar8 + uVar11] = *(double *)((long)&peVar6->super_ChNodeXYZ + uVar11 * 8 + 0x20);
          uVar11 = uVar11 + 1;
        } while (uVar11 != 3);
      }
      uVar14 = (ulong)((int)uVar14 + 1);
      uVar13 = uVar13 + 3;
      uVar8 = uVar8 + 3;
    } while (uVar14 < (ulong)(lVar12 >> 4));
  }
  *T = (this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj.ChTime;
  return;
}

Assistant:

void ChMatterSPH::IntStateGather(const unsigned int off_x,  // offset in x state vector
                                 ChState& x,                // state vector, position part
                                 const unsigned int off_v,  // offset in v state vector
                                 ChStateDelta& v,           // state vector, speed part
                                 double& T)                 // time
{
    for (unsigned int j = 0; j < nodes.size(); j++) {
        x.segment(off_x + 3 * j, 3) = nodes[j]->pos.eigen();
        v.segment(off_v + 3 * j, 3) = nodes[j]->pos_dt.eigen();
    }
    T = GetChTime();
}